

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordManager.cpp
# Opt level: O3

set<Addr,_std::less<Addr>,_std::allocator<Addr>_> * __thiscall
RecordManager::FindSuchRecord
          (set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *__return_storage_ptr__,
          RecordManager *this,STMT *S)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  iterator iVar6;
  ulong uVar7;
  long *plVar8;
  RecordSet *this_00;
  long lVar9;
  ulong uVar10;
  pointer pcVar11;
  string filename;
  Addr p;
  Record R;
  long *local_160;
  long local_150;
  long lStack_148;
  Addr local_140;
  RecordSet *local_138;
  key_type local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_f0 [8];
  _Alloc_hider local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined8 local_c8;
  int local_c0;
  int local_b8;
  _Alloc_hider local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  undefined8 local_90;
  Record local_88;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_140.BlockNum = 1;
  local_140.FileOff = 0;
  Record::Record(&local_88);
  std::operator+(&local_110,&this->Direction,&S->tableName);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
  local_160 = &local_150;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_150 = *plVar8;
    lStack_148 = plVar5[3];
  }
  else {
    local_150 = *plVar8;
    local_160 = (long *)*plVar5;
  }
  lVar9 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_130,local_160,lVar9 + (long)local_160);
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RecordSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RecordSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RecordSet>_>_>
          ::find(&(this->Total_Record)._M_t,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  this_00 = (RecordSet *)(iVar6._M_node + 2);
  local_138 = this_00;
  do {
    iVar4 = RecordSet::FindRecord(this_00,local_140,&local_88);
    if (iVar4 != 0) {
      if (iVar4 == -1) {
        if (local_160 != &local_150) {
          operator_delete(local_160,local_150 + 1);
        }
        std::vector<Keys,_std::allocator<Keys>_>::~vector(&local_88.KS);
        if (local_88.KF.super__Vector_base<Keyf,_std::allocator<Keyf>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.KF.super__Vector_base<Keyf,_std::allocator<Keyf>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_88.KF.super__Vector_base<Keyf,_std::allocator<Keyf>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.KF.super__Vector_base<Keyf,_std::allocator<Keyf>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_88.KI.super__Vector_base<Keyi,_std::allocator<Keyi>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.KI.super__Vector_base<Keyi,_std::allocator<Keyi>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_88.KI.super__Vector_base<Keyi,_std::allocator<Keyi>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.KI.super__Vector_base<Keyi,_std::allocator<Keyi>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        return __return_storage_ptr__;
      }
      pcVar11 = (S->c_list->super__Vector_base<condition,_std::allocator<condition>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((S->c_list->super__Vector_base<condition,_std::allocator<condition>_>)._M_impl.
          super__Vector_impl_data._M_finish != pcVar11) {
        lVar9 = 0;
        uVar10 = 0;
        do {
          local_f0._0_4_ = *(int *)((long)&pcVar11->colunmID + lVar9);
          local_e8._M_p = (pointer)&local_d8;
          lVar2 = *(long *)((long)&(pcVar11->colunmName)._M_dataplus._M_p + lVar9);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e8,lVar2,
                     *(long *)((long)&(pcVar11->colunmName)._M_string_length + lVar9) + lVar2);
          local_c0 = *(int *)((long)&pcVar11->op + lVar9);
          local_c8 = *(undefined8 *)(&pcVar11->isIndex + lVar9);
          local_b8 = *(int *)((long)&(pcVar11->key).type + lVar9);
          lVar2 = *(long *)((long)&(pcVar11->key).charV._M_dataplus._M_p + lVar9);
          local_b0._M_p = (pointer)&local_a0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,lVar2,
                     *(long *)((long)&(pcVar11->key).charV._M_string_length + lVar9) + lVar2);
          local_90 = *(undefined8 *)((long)&(pcVar11->key).intV + lVar9);
          bVar3 = Record::Check(&local_88,(condition *)local_f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_p != &local_a0) {
            operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_p != &local_d8) {
            operator_delete(local_e8._M_p,local_d8._M_allocated_capacity + 1);
          }
          if (!bVar3) goto LAB_00121ef5;
          uVar10 = uVar10 + 1;
          pcVar11 = (S->c_list->super__Vector_base<condition,_std::allocator<condition>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          uVar7 = ((long)(S->c_list->super__Vector_base<condition,_std::allocator<condition>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)pcVar11 >> 3) *
                  0x4ec4ec4ec4ec4ec5;
          lVar9 = lVar9 + 0x68;
        } while (uVar10 <= uVar7 && uVar7 - uVar10 != 0);
      }
      std::_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>>::
      _M_insert_unique<Addr_const&>
                ((_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>> *)
                 __return_storage_ptr__,&local_140);
    }
LAB_00121ef5:
    this_00 = local_138;
    RecordSet::Addp(local_138,&local_140);
  } while( true );
}

Assistant:

set<Addr> RecordManager::FindSuchRecord(STMT S) {
	set<Addr> ans;
	Addr p = { 1, 0 };
	Record R;
	string filename = Direction + S.tableName + "_rcd.dat";
	RecordSet& RS = this->FindRecordSet(filename);
	while (1) {
		int Found = RS.FindRecord(p, R);
		if (Found == -1)
			break;					//�Ѿ������¼�ļ�ĩβ�ˣ�����ѭ��
		if (Found == 0){
            RS.Addp(p);
            continue;
        }
		else {						//������¼��Ч�����������
			bool flag = true;
			int i;
			for (i = 0; i < S.c_list->size(); i++) {
				if (R.Check(S.c_list->at(i)) == false) {
					flag = false;	//����һ�����������㣬ֱ����̭
					break;
				}
			}
			if (flag == true) {
				ans.insert(p);		//�������������ģ������ַ������������
			}
		}
		RS.Addp(p);					//��ַ����
	}
	return ans;
}